

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<float> * __thiscall
VW::config::typed_option<float>::value(typed_option<float> *this,float value)

{
  typed_option<float> *in_RDI;
  float *in_stack_00000008;
  shared_ptr<float> *in_stack_ffffffffffffffe0;
  
  std::make_shared<float,float&>(in_stack_00000008);
  std::shared_ptr<float>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<float> *)in_RDI);
  std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)0x35bf16);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }